

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_prec.c
# Opt level: O1

int Precond(sunrealtype t,N_Vector c,N_Vector fc,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  long lVar1;
  undefined4 *puVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  double dVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  sunrealtype *rate;
  long lVar17;
  ulong uVar18;
  undefined4 in_register_00000014;
  ulong uVar19;
  double dVar20;
  double dVar21;
  ulong local_f8;
  long local_f0;
  double local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  
  uVar9 = *(undefined8 *)((long)user_data + 0x988);
  lVar15 = N_VGetArrayPointer(SUB84(t,0),c,fc,CONCAT44(in_register_00000014,jok));
  uVar10 = *(undefined8 *)((long)user_data + 0x980);
  uVar13 = CVodeGetErrWeights(uVar9,uVar10);
  if ((int)uVar13 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetErrWeights",
            (ulong)uVar13);
LAB_00103b44:
    iVar14 = 1;
  }
  else {
    lVar16 = N_VGetArrayPointer(uVar10);
    uVar13 = *(uint *)((long)user_data + 0x48);
    uVar4 = *(uint *)((long)user_data + 0x58);
    dVar3 = *(double *)((long)user_data + 0x2b0);
    uVar5 = *(uint *)((long)user_data + 0x5c);
    iVar14 = *(int *)((long)user_data + 0x60);
    iVar6 = *(int *)((long)user_data + 100);
    rate = (sunrealtype *)N_VGetArrayPointer(*(undefined8 *)((long)user_data + 0x978));
    dVar20 = (double)N_VWrmsNorm(fc,uVar10);
    if (0 < (long)iVar14) {
      dVar20 = ABS(gamma) * 1000.0 * 2.220446049250313e-16 * 216.0 * dVar20;
      uVar19 = -(ulong)(dVar20 == 0.0);
      local_58 = (double)(uVar19 & 0x3ff0000000000000 | ~uVar19 & (ulong)dVar20);
      local_f0 = 0;
      do {
        if (0 < (int)uVar5) {
          iVar7 = *(int *)((long)user_data + local_f0 * 4 + 0xb8);
          local_f8 = 0;
          do {
            if (0 < (int)uVar13) {
              iVar8 = *(int *)((long)user_data + local_f8 * 4 + 0xb0);
              lVar17 = (long)(int)(uVar13 * iVar8 + iVar7 * iVar6);
              uVar19 = 0;
              do {
                lVar1 = uVar19 + lVar17;
                dVar20 = *(double *)(lVar15 + lVar1 * 8);
                dVar12 = ABS(dVar20) * dVar3;
                dVar21 = local_58 / *(double *)(lVar16 + lVar1 * 8);
                if (dVar12 <= dVar21) {
                  dVar12 = dVar21;
                }
                *(double *)(lVar15 + lVar1 * 8) = dVar20 + dVar12;
                WebRates(*(double *)((long)user_data + 0x2a0) * (double)iVar8,
                         *(double *)((long)user_data + 0x2a8) * (double)iVar7,dVar20,
                         (sunrealtype *)
                         (lVar15 + (long)(*(int *)((long)user_data + 0x50) * iVar7 + iVar8) *
                                   (long)*(int *)((long)user_data + 0x40) * 8),rate,
                         (WebData)user_data);
                lVar11 = *(long *)(*(long *)((long)user_data +
                                            local_f8 * 8 + local_f0 * (ulong)uVar5 * 8) + uVar19 * 8
                                  );
                uVar18 = 0;
                do {
                  *(double *)(lVar11 + uVar18 * 8) =
                       (rate[uVar18] -
                       *(double *)((long)user_data + uVar18 * 8 + lVar17 * 8 + 0x2b8)) *
                       (-gamma / dVar12);
                  uVar18 = uVar18 + 1;
                } while (uVar13 != uVar18);
                local_48 = SUB84(dVar20,0);
                uStack_44 = (undefined4)((ulong)dVar20 >> 0x20);
                puVar2 = (undefined4 *)(lVar15 + lVar1 * 8);
                *puVar2 = local_48;
                puVar2[1] = uStack_44;
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar13);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != uVar5);
        }
        local_f0 = local_f0 + 1;
      } while (local_f0 != iVar14);
    }
    if (0 < (int)uVar4) {
      lVar15 = (long)(int)uVar13;
      uVar19 = 0;
      do {
        SUNDlsMat_denseAddIdentity(*(undefined8 *)((long)user_data + uVar19 * 8),lVar15);
        lVar16 = SUNDlsMat_denseGETRF
                           (*(undefined8 *)((long)user_data + uVar19 * 8),lVar15,lVar15,
                            *(undefined8 *)((long)user_data + uVar19 * 8 + 0x20));
        if (lVar16 != 0) goto LAB_00103b44;
        uVar19 = uVar19 + 1;
      } while (uVar4 != uVar19);
    }
    *jcurPtr = 1;
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

static int Precond(sunrealtype t, N_Vector c, N_Vector fc, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int i, if0, if00, ig, igx, igy, j, jj, jx, jy;
  int *jxr, *jyr, ngrp, ngx, ngy, mxmp, mp, retval;
  sunindextype denseretval;
  sunrealtype uround, fac, r, r0, save, srur;
  sunrealtype *f1, *fsave, *cdata, *rewtdata;
  WebData wdata;
  void* cvode_mem;
  N_Vector rewt;

  wdata     = (WebData)user_data;
  cvode_mem = wdata->cvode_mem;
  cdata     = N_VGetArrayPointer(c);
  rewt      = wdata->rewt;
  retval    = CVodeGetErrWeights(cvode_mem, rewt);
  if (check_retval(&retval, "CVodeGetErrWeights", 1)) { return (1); }
  rewtdata = N_VGetArrayPointer(rewt);

  uround = SUN_UNIT_ROUNDOFF;

  P     = wdata->P;
  pivot = wdata->pivot;
  jxr   = wdata->jxr;
  jyr   = wdata->jyr;
  mp    = wdata->mp;
  srur  = wdata->srur;
  ngrp  = wdata->ngrp;
  ngx   = wdata->ngx;
  ngy   = wdata->ngy;
  mxmp  = wdata->mxmp;
  fsave = wdata->fsave;

  /* Make mp calls to fblock to approximate each diagonal block of Jacobian.
     Here, fsave contains the base value of the rate vector and
     r0 is a minimum increment factor for the difference quotient. */

  f1 = N_VGetArrayPointer(wdata->tmp);

  fac = N_VWrmsNorm(fc, rewt);
  r0  = SUN_RCONST(1000.0) * SUNRabs(gamma) * uround * NEQ * fac;
  if (r0 == ZERO) { r0 = ONE; }

  for (igy = 0; igy < ngy; igy++)
  {
    jy   = jyr[igy];
    if00 = jy * mxmp;
    for (igx = 0; igx < ngx; igx++)
    {
      jx  = jxr[igx];
      if0 = if00 + jx * mp;
      ig  = igx + igy * ngx;
      /* Generate ig-th diagonal block */
      for (j = 0; j < mp; j++)
      {
        /* Generate the jth column as a difference quotient */
        jj   = if0 + j;
        save = cdata[jj];
        r    = MAX(srur * SUNRabs(save), r0 / rewtdata[jj]);
        cdata[jj] += r;
        fac = -gamma / r;
        fblock(t, cdata, jx, jy, f1, wdata);
        for (i = 0; i < mp; i++)
        {
          P[ig][j][i] = (f1[i] - fsave[if0 + i]) * fac;
        }
        cdata[jj] = save;
      }
    }
  }

  /* Add identity matrix and do LU decompositions on blocks. */

  for (ig = 0; ig < ngrp; ig++)
  {
    SUNDlsMat_denseAddIdentity(P[ig], mp);
    denseretval = SUNDlsMat_denseGETRF(P[ig], mp, mp, pivot[ig]);
    if (denseretval != 0) { return (1); }
  }

  *jcurPtr = SUNTRUE;
  return (0);
}